

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.h
# Opt level: O2

NetInterface * FS::operator<<(NetInterface *sink,StateArg sA)

{
  int i;
  StateArg local_10;
  
  local_10 = sA;
  if (sA.type == INT) {
    i = StateArg::getInt(&local_10);
    ::operator<<(sink,i);
  }
  else {
    if (sA.type != NONE) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/glowmouse[P]beefocus/firmware/focuser_state.h"
                    ,0x1d8,"T &FS::operator<<(T &, StateArg) [T = NetInterface]");
    }
    ::operator<<(sink,"NoArg");
  }
  return sink;
}

Assistant:

T& operator<<( T& sink, StateArg sA )
{
  switch (sA.getType() )
  {
    case StateArg::Type::NONE:
      sink << "NoArg";
      break;
    case StateArg::Type::INT:
      sink << sA.getInt();
      break;
    default:
      assert(0);
  }
  return sink; 
}